

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFromBinary(uchar *value,size_t size)

{
  long in_RDX;
  size_t extraout_RDX;
  size_t i;
  long lVar1;
  SimpleString SVar2;
  SimpleString local_40;
  
  SimpleString::SimpleString((SimpleString *)value,"");
  for (lVar1 = 0; in_RDX != lVar1; lVar1 = lVar1 + 1) {
    StringFromFormat((char *)&local_40,"%02X ",(ulong)*(byte *)(size + lVar1));
    SimpleString::operator+=((SimpleString *)value,local_40.buffer_);
    SimpleString::~SimpleString(&local_40);
  }
  SimpleString::size((SimpleString *)value);
  SimpleString::subString(&local_40,(size_t)value,0);
  SimpleString::operator=((SimpleString *)value,&local_40);
  SimpleString::~SimpleString(&local_40);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)value;
  return SVar2;
}

Assistant:

SimpleString StringFromBinary(const unsigned char* value, size_t size)
{
    SimpleString result;

    for (size_t i = 0; i < size; i++) {
        result += StringFromFormat("%02X ", value[i]);
    }
    result = result.subString(0, result.size() - 1);

    return result;
}